

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O2

int32_t get_algorithm<int>(int d)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int32_t iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  
  if (d == 0) {
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x5ab,"libdivide_internal_s32_gen",
            "divider must be != 0");
    abort();
  }
  uVar5 = (ulong)(uint)-d;
  if (0 < d) {
    uVar5 = (ulong)(uint)d;
  }
  uVar3 = (uint)uVar5;
  if ((uVar3 - 1 & uVar3) != 0) {
    uVar7 = 0x1e - LZCOUNT(uVar3);
    uVar1 = (ulong)(uint)(1 << (uVar7 & 0x1f)) << 0x20;
    iVar2 = (int)(uVar1 / uVar5);
    iVar6 = (int)(uVar1 % uVar5);
    if (uVar3 - iVar6 >> ((byte)~(byte)LZCOUNT(uVar3) & 0x1f) == 0) {
      iVar4 = 2 - (uint)((uVar7 & 0x40) == 0);
    }
    else {
      iVar2 = (uint)(iVar6 < 0 || uVar3 <= (uint)(iVar6 * 2)) + iVar2 * 2;
      iVar4 = 2;
    }
    iVar6 = -2 - iVar2;
    if (d < 0) {
      iVar6 = iVar2;
    }
    if (iVar6 != -1) {
      return iVar4;
    }
  }
  return 0;
}

Assistant:

static LIBDIVIDE_INLINE struct libdivide_s32_t libdivide_internal_s32_gen(
    int32_t d, int branchfree) {
    if (d == 0) {
        LIBDIVIDE_ERROR("divider must be != 0");
    }

    struct libdivide_s32_t result;

    // If d is a power of 2, or negative a power of 2, we have to use a shift.
    // This is especially important because the magic algorithm fails for -1.
    // To check if d is a power of 2 or its inverse, it suffices to check
    // whether its absolute value has exactly one bit set. This works even for
    // INT_MIN, because abs(INT_MIN) == INT_MIN, and INT_MIN has one bit set
    // and is a power of 2.
    uint32_t ud = (uint32_t)d;
    uint32_t absD = (d < 0) ? -ud : ud;
    uint32_t floor_log_2_d = 31 - libdivide_count_leading_zeros32(absD);
    // check if exactly one bit is set,
    // don't care if absD is 0 since that's divide by zero
    if ((absD & (absD - 1)) == 0) {
        // Branchfree and normal paths are exactly the same
        result.magic = 0;
        result.more = (uint8_t)(floor_log_2_d | (d < 0 ? LIBDIVIDE_NEGATIVE_DIVISOR : 0));
    } else {
        LIBDIVIDE_ASSERT(floor_log_2_d >= 1);

        uint8_t more;
        // the dividend here is 2**(floor_log_2_d + 31), so the low 32 bit word
        // is 0 and the high word is floor_log_2_d - 1
        uint32_t rem, proposed_m;
        proposed_m = libdivide_64_div_32_to_32((uint32_t)1 << (floor_log_2_d - 1), 0, absD, &rem);
        const uint32_t e = absD - rem;

        // We are going to start with a power of floor_log_2_d - 1.
        // This works if works if e < 2**floor_log_2_d.
        if (!branchfree && e < ((uint32_t)1 << floor_log_2_d)) {
            // This power works
            more = (uint8_t)(floor_log_2_d - 1);
        } else {
            // We need to go one higher. This should not make proposed_m
            // overflow, but it will make it negative when interpreted as an
            // int32_t.
            proposed_m += proposed_m;
            const uint32_t twice_rem = rem + rem;
            if (twice_rem >= absD || twice_rem < rem) proposed_m += 1;
            more = (uint8_t)(floor_log_2_d | LIBDIVIDE_ADD_MARKER);
        }

        proposed_m += 1;
        int32_t magic = (int32_t)proposed_m;

        // Mark if we are negative. Note we only negate the magic number in the
        // branchfull case.
        if (d < 0) {
            more |= LIBDIVIDE_NEGATIVE_DIVISOR;
            if (!branchfree) {
                magic = -magic;
            }
        }

        result.more = more;
        result.magic = magic;
    }
    return result;
}